

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

uint32_t gravity_object_size(gravity_vm *vm,gravity_object_t *obj)

{
  gravity_object_t *obj_local;
  gravity_vm *vm_local;
  
  if ((obj == (gravity_object_t *)0x0) || (obj->isa == (gravity_class_t *)0x0)) {
    vm_local._4_4_ = 0;
  }
  else if (((obj->gc).visited & 1U) == 0) {
    if ((obj->gc).size == (gravity_gc_callback)0x0) {
      if (obj->isa == gravity_class_class) {
        vm_local._4_4_ = gravity_class_size(vm,obj);
      }
      else if (obj->isa == gravity_class_function) {
        vm_local._4_4_ = gravity_function_size(vm,(gravity_function_t *)obj);
      }
      else if (obj->isa == gravity_class_closure) {
        vm_local._4_4_ = gravity_closure_size(vm,(gravity_closure_t *)obj);
      }
      else if (obj->isa == gravity_class_instance) {
        vm_local._4_4_ = gravity_instance_size(vm,(gravity_instance_t *)obj);
      }
      else if (obj->isa == gravity_class_list) {
        vm_local._4_4_ = gravity_list_size(vm,(gravity_list_t *)obj);
      }
      else if (obj->isa == gravity_class_map) {
        vm_local._4_4_ = gravity_map_size(vm,(gravity_map_t *)obj);
      }
      else if (obj->isa == gravity_class_fiber) {
        vm_local._4_4_ = gravity_fiber_size(vm,(gravity_fiber_t *)obj);
      }
      else if (obj->isa == gravity_class_range) {
        vm_local._4_4_ = gravity_range_size(vm,(gravity_range_t *)obj);
      }
      else if (obj->isa == gravity_class_module) {
        vm_local._4_4_ = gravity_module_size(vm,(gravity_module_t *)obj);
      }
      else if (obj->isa == gravity_class_string) {
        vm_local._4_4_ = gravity_string_size(vm,(gravity_string_t *)obj);
      }
      else if (obj->isa == gravity_class_upvalue) {
        vm_local._4_4_ = gravity_upvalue_size(vm,(gravity_upvalue_t *)obj);
      }
      else {
        vm_local._4_4_ = 0;
      }
    }
    else {
      vm_local._4_4_ = (*(obj->gc).size)(vm,obj);
    }
  }
  else {
    vm_local._4_4_ = 0;
  }
  return vm_local._4_4_;
}

Assistant:

uint32_t gravity_object_size (gravity_vm *vm, gravity_object_t *obj) {
    if ((!obj) || (!OBJECT_IS_VALID(obj))) return 0;
    
    // check if object has already been visited (to avoid infinite loop)
    if (obj->gc.visited) return 0;
    
    if (obj->gc.size) return obj->gc.size(vm, obj);
    else if (OBJECT_ISA_CLASS(obj)) return gravity_class_size(vm, (gravity_class_t *)obj);
    else if (OBJECT_ISA_FUNCTION(obj)) return gravity_function_size(vm, (gravity_function_t *)obj);
    else if (OBJECT_ISA_CLOSURE(obj)) return gravity_closure_size(vm, (gravity_closure_t *)obj);
    else if (OBJECT_ISA_INSTANCE(obj)) return gravity_instance_size(vm, (gravity_instance_t *)obj);
    else if (OBJECT_ISA_LIST(obj)) return gravity_list_size(vm, (gravity_list_t *)obj);
    else if (OBJECT_ISA_MAP(obj)) return gravity_map_size(vm, (gravity_map_t *)obj);
    else if (OBJECT_ISA_FIBER(obj)) return gravity_fiber_size(vm, (gravity_fiber_t *)obj);
    else if (OBJECT_ISA_RANGE(obj)) return gravity_range_size(vm, (gravity_range_t *)obj);
    else if (OBJECT_ISA_MODULE(obj)) return gravity_module_size(vm, (gravity_module_t *)obj);
    else if (OBJECT_ISA_STRING(obj)) return gravity_string_size(vm, (gravity_string_t *)obj);
    else if (OBJECT_ISA_UPVALUE(obj)) return gravity_upvalue_size(vm, (gravity_upvalue_t *)obj);
    return 0;
}